

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O3

bool StringFormatter<unsigned_long_&,_unsigned_long,_unsigned_long_&,_unsigned_long,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_char_&,_unsigned_short_&,_unsigned_int_&,_unsigned_long_&>
     ::output_wchar<unsigned_long>(ostream *os,unsigned_long *value)

{
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> wc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  size_type *local_70;
  size_type local_68;
  size_type local_60;
  undefined8 uStack_58;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_50;
  long local_48;
  wchar_t local_40;
  undefined4 uStack_3c;
  undefined1 *local_30 [2];
  
  local_40 = (wchar_t)*value;
  local_48 = 1;
  uStack_3c = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_50._M_current = &local_40;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_90,4,'\0');
  utf32toutf8<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              )local_30,local_50,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_50._M_current + local_48),
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_90._M_dataplus._M_p);
  local_90._M_string_length = (long)local_30[0] - (long)local_90._M_dataplus._M_p;
  *local_30[0] = 0;
  local_70 = (size_type *)local_90._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == &local_90.field_2) {
    uStack_58 = local_90.field_2._8_8_;
    local_70 = &local_60;
  }
  local_60 = local_90.field_2._M_allocated_capacity;
  local_68 = local_90._M_string_length;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_70,local_90._M_string_length);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50._M_current != &local_40) {
    operator_delete(local_50._M_current,CONCAT44(uStack_3c,local_40) * 4 + 4);
  }
  return true;
}

Assistant:

static bool output_wchar(std::ostream& os, const T& value)
    { 
        if constexpr (std::is_integral_v<T>) {
            std::basic_string<wchar_t> wc(1, wchar_t(value));
            os << string::convert<char>(wc);
            return true;
        }
        return false;
    }